

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  int iVar1;
  ulong uVar2;
  Pair *__dest;
  int iVar3;
  ulong uVar4;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  Pair *pPVar10;
  ulong uVar5;
  
  iVar1 = (this->Data).Size;
  uVar2 = (ulong)iVar1;
  __dest = (this->Data).Data;
  uVar5 = uVar2;
  pPVar10 = __dest;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    do {
      uVar4 = uVar5 >> 1;
      uVar6 = uVar4;
      if (pPVar10[uVar4].key < key) {
        uVar6 = ~uVar4 + uVar5;
        pPVar10 = pPVar10 + uVar4 + 1;
      }
      uVar5 = uVar6;
    } while (uVar6 != 0);
  }
  if ((pPVar10 == __dest + uVar2) || (pPVar10->key != key)) {
    if ((pPVar10 < __dest) || (__dest + uVar2 < pPVar10)) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4e6,
                    "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
                   );
    }
    lVar9 = (long)pPVar10 - (long)__dest;
    if (iVar1 == (this->Data).Capacity) {
      if (iVar1 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar1 / 2 + iVar1;
      }
      iVar8 = iVar1 + 1;
      if (iVar1 + 1 < iVar3) {
        iVar8 = iVar3;
      }
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (Pair *)(*GImAllocatorAllocFunc)((long)iVar8 << 4,GImAllocatorUserData);
      pPVar10 = (this->Data).Data;
      if (pPVar10 != (Pair *)0x0) {
        memcpy(__dest,pPVar10,(long)(this->Data).Size << 4);
        pPVar10 = (this->Data).Data;
        if (pPVar10 != (Pair *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pPVar10,GImAllocatorUserData);
      }
      (this->Data).Data = __dest;
      (this->Data).Capacity = iVar8;
      uVar2 = (ulong)(this->Data).Size;
    }
    lVar7 = uVar2 - (lVar9 >> 4);
    if (lVar7 != 0 && lVar9 >> 4 <= (long)uVar2) {
      memmove((void *)((long)__dest + lVar9 + 0x10),(void *)((long)__dest + lVar9),lVar7 * 0x10);
      __dest = (this->Data).Data;
    }
    *(ImGuiID *)((long)__dest + lVar9) = key;
    *(void **)((long)__dest + lVar9 + 8) = default_val;
    (this->Data).Size = (this->Data).Size + 1;
    pPVar10 = (Pair *)(lVar9 + (long)(this->Data).Data);
  }
  return (void **)&pPVar10->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_p;
}